

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::WriteToShardStatusFileIfNeeded(void)

{
  char *pcVar1;
  FILE *__stream;
  FILE *file;
  char *test_shard_file;
  char *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  
  pcVar1 = posix::GetEnv((char *)0x155ad0);
  if (pcVar1 != (char *)0x0) {
    __stream = (FILE *)posix::FOpen(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    if (__stream == (FILE *)0x0) {
      ColoredPrintf(kRed,
                    "Could not write to the test shard status file \"%s\" specified by the %s environment variable.\n"
                    ,pcVar1,"GTEST_SHARD_STATUS_FILE");
      fflush(_stdout);
      exit(1);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void WriteToShardStatusFileIfNeeded() {
  const char* const test_shard_file = posix::GetEnv(kTestShardStatusFile);
  if (test_shard_file != nullptr) {
    FILE* const file = posix::FOpen(test_shard_file, "w");
    if (file == nullptr) {
      ColoredPrintf(GTestColor::kRed,
                    "Could not write to the test shard status file \"%s\" "
                    "specified by the %s environment variable.\n",
                    test_shard_file, kTestShardStatusFile);
      fflush(stdout);
      exit(EXIT_FAILURE);
    }
    fclose(file);
  }
}